

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

TestCaseGroup * vkt::SpirVAssembly::createOpSourceTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  mapped_type *pmVar2;
  size_t num4ByteChars;
  long lVar3;
  allocator<char> local_377;
  allocator<char> local_376;
  allocator<char> local_375;
  allocator<char> local_374;
  allocator<char> local_373;
  allocator<char> local_372;
  allocator<char> local_371;
  allocator<char> local_370;
  allocator<char> local_36f;
  allocator<char> local_36e;
  allocator<char> local_36d;
  allocator<char> local_36c;
  allocator<char> local_36b;
  allocator<char> local_36a;
  allocator<char> local_369;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> opSourceTests;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  RGBA defaultColors [4];
  string opsourceGLSLWithFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  string local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragments;
  NameCodePair tests [9];
  
  defaultColors[0].m_value = 0;
  defaultColors[1].m_value = 0;
  defaultColors[2].m_value = 0;
  defaultColors[3].m_value = 0;
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"opsource","OpSource instruction");
  opSourceTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
  .ptr = pTVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&opsourceGLSLWithFile,
             "%opsrcfile = OpString \"foo.vert\"\nOpSource GLSL 450 %opsrcfile ",
             (allocator<char> *)tests);
  passthruFragments_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>((string *)tests,"unknown",&local_369);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[0].code,"OpSource Unknown 321",&local_36a);
  std::__cxx11::string::string<std::allocator<char>>((string *)(tests + 1),"essl",&local_36b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[1].code,"OpSource ESSL 310",&local_36c);
  std::__cxx11::string::string<std::allocator<char>>((string *)(tests + 2),"glsl",&local_36d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[2].code,"OpSource GLSL 450",&local_36e);
  std::__cxx11::string::string<std::allocator<char>>((string *)(tests + 3),"opencl_cpp",&local_36f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[3].code,"OpSource OpenCL_CPP 120",&local_370);
  std::__cxx11::string::string<std::allocator<char>>((string *)(tests + 4),"opencl_c",&local_371);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[4].code,"OpSource OpenCL_C 120",&local_372);
  std::__cxx11::string::string<std::allocator<char>>((string *)(tests + 5),"multiple",&local_373);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[5].code,"OpSource GLSL 450\nOpSource GLSL 450",&local_374);
  std::__cxx11::string::string<std::allocator<char>>((string *)(tests + 6),"file",&local_375);
  std::__cxx11::string::string((string *)&tests[6].code,(string *)&opsourceGLSLWithFile);
  std::__cxx11::string::string<std::allocator<char>>((string *)(tests + 7),"source",&local_376);
  std::operator+(&tests[7].code,&opsourceGLSLWithFile,"\"void main(){}\"");
  std::__cxx11::string::string<std::allocator<char>>((string *)(tests + 8),"longsource",&local_377);
  std::operator+(&local_2c8,&opsourceGLSLWithFile,'\"');
  (anonymous_namespace)::makeLongUTF8String_abi_cxx11_
            (&local_2e8,(_anonymous_namespace_ *)0xfffa,num4ByteChars);
  std::operator+(&local_308,&local_2c8,&local_2e8);
  std::operator+(&local_358,&local_308,"ccc");
  std::operator+(&tests[8].code,&local_358,'\"');
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2c8);
  getDefaultColors(&defaultColors);
  for (lVar3 = 0;
      pTVar1 = opSourceTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, lVar3 != 0x240; lVar3 = lVar3 + 0x40) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_358,"debug",(allocator<char> *)&local_308);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&fragments,&local_358);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    std::__cxx11::string::~string((string *)&local_358);
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    local_358._M_string_length = 0;
    local_358.field_2._M_local_buf[0] = '\0';
    createTestsForAllStages
              ((string *)((long)&tests[0].name._M_dataplus._M_p + lVar3),&defaultColors,
               &defaultColors,&fragments,
               opSourceTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr,QP_TEST_RESULT_FAIL,&local_358);
    std::__cxx11::string::~string((string *)&local_358);
  }
  opSourceTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
  .ptr = (TestCaseGroup *)0x0;
  lVar3 = 0x200;
  do {
    createOpSourceTests::NameCodePair::~NameCodePair
              ((NameCodePair *)((long)&tests[0].name._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x40;
  } while (lVar3 != -0x40);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&fragments._M_t);
  std::__cxx11::string::~string((string *)&opsourceGLSLWithFile);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&opSourceTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createOpSourceTests (tcu::TestContext& testCtx)
{
	struct NameCodePair { string name, code; };
	RGBA							defaultColors[4];
	de::MovePtr<tcu::TestCaseGroup> opSourceTests			(new tcu::TestCaseGroup(testCtx, "opsource", "OpSource instruction"));
	const std::string				opsourceGLSLWithFile	= "%opsrcfile = OpString \"foo.vert\"\nOpSource GLSL 450 %opsrcfile ";
	map<string, string>				fragments				= passthruFragments();
	const NameCodePair				tests[]					=
	{
		{"unknown", "OpSource Unknown 321"},
		{"essl", "OpSource ESSL 310"},
		{"glsl", "OpSource GLSL 450"},
		{"opencl_cpp", "OpSource OpenCL_CPP 120"},
		{"opencl_c", "OpSource OpenCL_C 120"},
		{"multiple", "OpSource GLSL 450\nOpSource GLSL 450"},
		{"file", opsourceGLSLWithFile},
		{"source", opsourceGLSLWithFile + "\"void main(){}\""},
		// Longest possible source string: SPIR-V limits instructions to 65535
		// words, of which the first 4 are opsourceGLSLWithFile; the rest will
		// contain 65530 UTF8 characters (one word each) plus one last word
		// containing 3 ASCII characters and \0.
		{"longsource", opsourceGLSLWithFile + '"' + makeLongUTF8String(65530) + "ccc" + '"'}
	};

	getDefaultColors(defaultColors);
	for (size_t testNdx = 0; testNdx < sizeof(tests) / sizeof(NameCodePair); ++testNdx)
	{
		fragments["debug"] = tests[testNdx].code;
		createTestsForAllStages(tests[testNdx].name, defaultColors, defaultColors, fragments, opSourceTests.get());
	}

	return opSourceTests.release();
}